

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  int iVar1;
  char cVar2;
  DTableDesc DVar3;
  uint uVar4;
  uint uVar5;
  sortedSymbol_t *psVar6;
  sortedSymbol_t *in_RCX;
  HUF_DTable *in_RDI;
  ulong in_R8;
  undefined4 in_R9D;
  U32 w_3;
  U32 *rankValPtr;
  U32 consumed;
  U32 minBits;
  U32 curr_1;
  U32 w_2;
  U32 nextRankVal;
  int rescale;
  U32 *rankVal0;
  U32 r;
  U32 w_1;
  U32 s;
  U32 curr;
  U32 nextRankStart;
  U32 w;
  HUF_ReadDTableX2_Workspace *wksp;
  U32 *rankStart;
  HUF_DEltX2 *dt;
  void *dtPtr;
  size_t iSize;
  U32 maxTableLog;
  DTableDesc dtd;
  U32 nbSymbols;
  U32 maxW;
  U32 tableLog;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar7;
  U32 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff68;
  int iVar9;
  undefined4 in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar10;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar11;
  undefined4 in_stack_ffffffffffffff8c;
  HUF_DEltX2 *DTable_00;
  uint local_48;
  undefined4 local_44;
  uint in_stack_ffffffffffffffc0;
  uint local_3c;
  uint local_38;
  size_t local_8;
  
  DVar3 = HUF_getDTableDesc(in_RDI);
  local_48 = (uint)DVar3 & 0xff;
  DTable_00 = (HUF_DEltX2 *)(in_RDI + 1);
  if (in_R8 < 0x84c) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    psVar6 = in_RCX + 0x2a8;
    memset(in_RCX + 0x270,0,0x34);
    memset(in_RCX + 0x2a4,0,0x3c);
    if (local_48 < 0xd) {
      local_8 = HUF_readStats_wksp((BYTE *)CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   (U32 *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                   in_stack_ffffffffffffff50,
                                   (U32 *)CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48),
                                   (void *)CONCAT44(in_stack_ffffffffffffff44,in_R9D),
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   (void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88),(size_t)in_RCX,
                                   (int)psVar6);
      uVar4 = ERR_isError(local_8);
      if (uVar4 == 0) {
        if (local_48 < local_38) {
          local_8 = 0xffffffffffffffd4;
        }
        else {
          if ((local_38 < 0xc) && (0xb < local_48)) {
            local_48 = 0xb;
          }
          local_3c = local_38;
          while (*(int *)(in_RCX + (ulong)local_3c * 4 + 0x270) == 0) {
            local_3c = local_3c - 1;
          }
          iVar11 = 0;
          for (uVar4 = 1; uVar4 < local_3c + 1; uVar4 = uVar4 + 1) {
            iVar9 = *(int *)(in_RCX + (ulong)uVar4 * 4 + 0x270);
            *(int *)(psVar6 + (ulong)uVar4 * 4) = iVar11;
            in_stack_ffffffffffffff84 = iVar11;
            iVar11 = iVar9 + iVar11;
          }
          *(int *)psVar6 = iVar11;
          *(int *)(psVar6 + (ulong)(local_3c + 1) * 4) = iVar11;
          for (uVar10 = 0; uVar10 < in_stack_ffffffffffffffc0; uVar10 = uVar10 + 1) {
            in_stack_ffffffffffffff7c = (uint)in_RCX[(ulong)uVar10 + 0x3e0].symbol;
            uVar8 = *(uint *)(psVar6 + (ulong)in_stack_ffffffffffffff7c * 4);
            *(uint *)(psVar6 + (ulong)in_stack_ffffffffffffff7c * 4) = uVar8 + 1;
            in_RCX[(ulong)uVar8 + 0x2e0].symbol = (BYTE)uVar10;
          }
          *(int *)psVar6 = 0;
          iVar9 = 0;
          for (uVar8 = 1; uVar8 < local_3c + 1; uVar8 = uVar8 + 1) {
            iVar1 = *(int *)(in_RCX + (ulong)uVar8 * 4 + 0x270);
            cVar2 = (char)uVar8;
            *(int *)(in_RCX + (ulong)uVar8 * 4) = iVar9;
            iVar9 = (iVar1 << (cVar2 + ((char)local_48 - (char)local_38) + -1 & 0x1fU)) + iVar9;
          }
          uVar5 = (local_38 + 1) - local_3c;
          for (uVar8 = uVar5; uVar8 < (local_48 - uVar5) + 1; uVar8 = uVar8 + 1) {
            for (uVar7 = 1; uVar7 < local_3c + 1; uVar7 = uVar7 + 1) {
              *(uint *)(in_RCX + (ulong)uVar7 * 4 + (ulong)uVar8 * 0x34) =
                   *(uint *)(in_RCX + (ulong)uVar7 * 4) >> ((byte)uVar8 & 0x1f);
            }
          }
          HUF_fillDTableX2(DTable_00,(U32)((ulong)psVar6 >> 0x20),in_RCX,
                           (U32 *)CONCAT44(uVar4,iVar11),
                           (rankValCol_t *)CONCAT44(in_stack_ffffffffffffff84,uVar10),
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffffc0);
          local_44._3_1_ = DVar3.reserved;
          local_44 = CONCAT22(CONCAT11(local_44._3_1_,(char)local_48),CONCAT11(1,DVar3.maxTableLog))
          ;
          *in_RDI = local_44;
        }
      }
    }
    else {
      local_8 = 0xffffffffffffffd4;
    }
  }
  return local_8;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog, maxW, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), flags);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */
    if (tableLog <= HUF_DECODER_FAST_TABLELOG && maxTableLog > HUF_DECODER_FAST_TABLELOG) maxTableLog = HUF_DECODER_FAST_TABLELOG;

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        rankStart[maxW+1] = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}